

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceMatrix4x4.cpp
# Opt level: O1

float __thiscall IceMaths::Matrix4x4::Determinant(Matrix4x4 *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar1 = this->m[1][1];
  fVar2 = this->m[2][2];
  fVar3 = this->m[3][3];
  fVar4 = this->m[1][2];
  fVar5 = this->m[2][3];
  fVar6 = this->m[3][1];
  fVar7 = this->m[1][3];
  fVar8 = this->m[2][1];
  fVar9 = this->m[3][2];
  fVar10 = this->m[2][0];
  fVar11 = this->m[3][0];
  fVar12 = this->m[1][0];
  return (((fVar1 * fVar5 * fVar11 + fVar7 * fVar10 * fVar6 + fVar3 * fVar8 * fVar12) -
          (fVar5 * fVar6 * fVar12 + fVar3 * fVar10 * fVar1 + fVar7 * fVar8 * fVar11)) *
          this->m[0][2] +
         (((fVar7 * fVar8 * fVar9 + fVar1 * fVar2 * fVar3 + fVar4 * fVar5 * fVar6) -
          (fVar3 * fVar8 * fVar4 + fVar2 * fVar6 * fVar7 + fVar1 * fVar5 * fVar9)) * this->m[0][0] -
         ((fVar2 * fVar12 * fVar3 + fVar4 * fVar5 * fVar11 + fVar9 * fVar7 * fVar10) -
         (fVar2 * fVar11 * fVar7 + fVar5 * fVar9 * fVar12 + fVar4 * fVar3 * fVar10)) * this->m[0][1]
         )) - ((fVar4 * fVar10 * fVar6 + fVar8 * fVar12 * fVar9 + fVar1 * fVar2 * fVar11) -
              (fVar9 * fVar10 * fVar1 + fVar2 * fVar6 * fVar12 + fVar8 * fVar11 * fVar4)) *
              this->m[0][3];
}

Assistant:

float Matrix4x4::CoFactor(udword row, udword col) const
{
	return	 (( m[(row+1)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+3)&3][(col+3)&3] +
				m[(row+1)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+3)&3][(col+1)&3] +
				m[(row+1)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+3)&3][(col+2)&3])
			-  (m[(row+3)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+1)&3][(col+3)&3] +
				m[(row+3)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+1)&3][(col+1)&3] +
				m[(row+3)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+1)&3][(col+2)&3])) * ((row + col) & 1 ? -1.0f : +1.0f);
}